

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

_Bool sk_address_is_local(SockAddr *addr)

{
  SockAddr *addr_local;
  
  if (addr->superfamily == UNRESOLVED) {
    addr_local._7_1_ = false;
  }
  else if (addr->superfamily == UNIX) {
    addr_local._7_1_ = true;
  }
  else {
    addr_local._7_1_ = sockaddr_is_loopback(addr->ais->ai_addr);
  }
  return addr_local._7_1_;
}

Assistant:

bool sk_address_is_local(SockAddr *addr)
{
    if (addr->superfamily == UNRESOLVED)
        return false;                  /* we don't know; assume not */
    else if (addr->superfamily == UNIX)
        return true;
    else {
#ifndef NO_IPV6
        return sockaddr_is_loopback(addr->ais->ai_addr);
#else
        struct in_addr a;
        SockAddrStep step;
        START_STEP(addr, step);
        assert(SOCKADDR_FAMILY(addr, step) == AF_INET);
        a.s_addr = htonl(addr->addresses[0]);
        return ipv4_is_loopback(a);
#endif
    }
}